

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void SparseKeygenRecurse<Blob<384>,Blob<224>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<384> *k,
               vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes)

{
  Blob<224> h;
  value_type local_58;
  
  local_58.bytes[0x10] = '\0';
  local_58.bytes[0x11] = '\0';
  local_58.bytes[0x12] = '\0';
  local_58.bytes[0x13] = '\0';
  local_58.bytes[0x14] = '\0';
  local_58.bytes[0x15] = '\0';
  local_58.bytes[0x16] = '\0';
  local_58.bytes[0x17] = '\0';
  local_58.bytes[0x18] = '\0';
  local_58.bytes[0x19] = '\0';
  local_58.bytes[0x1a] = '\0';
  local_58.bytes[0x1b] = '\0';
  local_58.bytes[0] = '\0';
  local_58.bytes[1] = '\0';
  local_58.bytes[2] = '\0';
  local_58.bytes[3] = '\0';
  local_58.bytes[4] = '\0';
  local_58.bytes[5] = '\0';
  local_58.bytes[6] = '\0';
  local_58.bytes[7] = '\0';
  local_58.bytes[8] = '\0';
  local_58.bytes[9] = '\0';
  local_58.bytes[10] = '\0';
  local_58.bytes[0xb] = '\0';
  local_58.bytes[0xc] = '\0';
  local_58.bytes[0xd] = '\0';
  local_58.bytes[0xe] = '\0';
  local_58.bytes[0xf] = '\0';
  if (start < 0x180) {
    do {
      flipbit(k,0x30,start);
      if (bitsleft == 1 || inclusive) {
        (*hash)(k,0x30,0,&local_58);
        std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back(hashes,&local_58);
      }
      if (1 < bitsleft) {
        SparseKeygenRecurse<Blob<384>,Blob<224>>(hash,start + 1,bitsleft + -1,inclusive,k,hashes);
      }
      flipbit(k,0x30,start);
      start = start + 1;
    } while (start != 0x180);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}